

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O3

unsigned_short
duckdb::BitwiseShiftLeftOperator::Operation<unsigned_short,unsigned_short,unsigned_short>
          (unsigned_short input,unsigned_short shift)

{
  OutOfRangeException *pOVar1;
  undefined6 in_register_0000003a;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if (shift < 0x11) {
    if (shift != 0) {
      if ((ushort)(1 << (0x10 - (byte)shift & 0x1f)) <= input) {
        pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Overflow in left shift (%s << %s)","");
        NumericHelper::ToString<unsigned_short>(&local_60,input);
        NumericHelper::ToString<unsigned_short>(&local_80,shift);
        OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                  (pOVar1,&local_a0,&local_60,&local_80);
        __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
      input = (unsigned_short)((int)CONCAT62(in_register_0000003a,input) << ((byte)shift & 0x1f));
    }
  }
  else {
    if (input != 0) {
      pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Left-shift value %s is out of range","");
      NumericHelper::ToString<unsigned_short>(&local_40,shift);
      OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar1,&local_a0,&local_40);
      __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    input = 0;
  }
  return input;
}

Assistant:

static inline TR Operation(TA input, TB shift) {
		TA max_shift = TA(sizeof(TA) * 8) + (NumericLimits<TA>::IsSigned() ? 0 : 1);
		if (input < 0) {
			throw OutOfRangeException("Cannot left-shift negative number %s", NumericHelper::ToString(input));
		}
		if (shift < 0) {
			throw OutOfRangeException("Cannot left-shift by negative number %s", NumericHelper::ToString(shift));
		}
		if (shift >= max_shift) {
			if (input == 0) {
				return 0;
			}
			throw OutOfRangeException("Left-shift value %s is out of range", NumericHelper::ToString(shift));
		}
		if (shift == 0) {
			return input;
		}
		TA max_value = UnsafeNumericCast<TA>((TA(1) << (max_shift - shift - 1)));
		if (input >= max_value) {
			throw OutOfRangeException("Overflow in left shift (%s << %s)", NumericHelper::ToString(input),
			                          NumericHelper::ToString(shift));
		}
		return UnsafeNumericCast<TR>(input << shift);
	}